

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# menu.cpp
# Opt level: O1

void __thiscall DMenu::Drawer(DMenu *this)

{
  FTexture *img;
  uint uVar1;
  double x;
  double y;
  
  if ((((CurrentMenu == this) && (0.0 < BackbuttonAlpha)) && (-1 < m_show_backbutton.Value)) &&
     (m_use_mouse.Value != 0)) {
    img = FTextureManager::operator()(&TexMan,gameinfo.mBackButton.Chars);
    y = 0.0;
    x = 0.0;
    if ((m_show_backbutton.Value & 1U) != 0) {
      uVar1 = (uint)((double)((uint)img->Width * 2) / (img->Scale).X);
      x = (double)(int)((screen->super_DSimpleCanvas).super_DCanvas.Width -
                       ((uVar1 & 1) + ((int)uVar1 >> 1)) * CleanXfac);
    }
    if ((m_show_backbutton.Value & 2U) != 0) {
      uVar1 = (uint)((double)((uint)img->Height * 2) / (img->Scale).Y);
      y = (double)(int)((screen->super_DSimpleCanvas).super_DCanvas.Height -
                       ((uVar1 & 1) + ((int)uVar1 >> 1)) * CleanYfac);
    }
    if (((this->super_DObject).field_0x25 != '\x01') ||
       (((this->super_DObject).field_0x24 == '\0' && (m_use_mouse.Value != 1)))) {
      DCanvas::DrawTexture
                ((DCanvas *)screen,img,x,y,0x40001393,(double)BackbuttonAlpha,1,0x4000138c,0);
      return;
    }
    DCanvas::DrawTexture((DCanvas *)screen,img,x,y,0x40001393,1,0x400013aa,0x28ffffff,0);
  }
  return;
}

Assistant:

void DMenu::Drawer () 
{
	if (this == DMenu::CurrentMenu && BackbuttonAlpha > 0 && m_show_backbutton >= 0 && m_use_mouse)
	{
		FTexture *tex = TexMan(gameinfo.mBackButton);
		int w = tex->GetScaledWidth() * CleanXfac;
		int h = tex->GetScaledHeight() * CleanYfac;
		int x = (!(m_show_backbutton&1))? 0:screen->GetWidth() - w;
		int y = (!(m_show_backbutton&2))? 0:screen->GetHeight() - h;
		if (mBackbuttonSelected && (mMouseCapture || m_use_mouse == 1))
		{
			screen->DrawTexture(tex, x, y, DTA_CleanNoMove, true, DTA_ColorOverlay, MAKEARGB(40, 255,255,255), TAG_DONE);
		}
		else
		{
			screen->DrawTexture(tex, x, y, DTA_CleanNoMove, true, DTA_AlphaF, BackbuttonAlpha, TAG_DONE);
		}
	}
}